

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

int pnga_initialize_comm(MPI_Comm comm)

{
  int iVar1;
  
  iVar1 = ARMCI_Init_mpi_comm(comm);
  if (iVar1 != 0) {
    pnga_initialize();
  }
  return iVar1;
}

Assistant:

int pnga_initialize_comm(MPI_Comm comm)
{
  /**
   * Initialize ARMCI first using communicator and then initialize GA using
   * conventional initialization program. The conventional initialization code
   * should recognize that ARMCI has already been initialized
   */
  int ret = ARMCI_Init_mpi_comm(comm);
  if (ret) {
    pnga_initialize();
  }
  return ret;
}